

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O2

void __thiscall
chrono::ChAssembly::ShowHierarchy(ChAssembly *this,ChStreamOutAscii *m_file,int level)

{
  element_type *peVar1;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  pointer psVar5;
  pointer psVar6;
  pointer psVar7;
  ChStreamOutAscii *pCVar8;
  pointer psVar9;
  uint uVar10;
  shared_ptr<chrono::ChMarker> *marker;
  pointer psVar11;
  pointer psVar12;
  shared_ptr<chrono::ChShaft> *shaft;
  pointer psVar13;
  pointer psVar14;
  shared_ptr<chrono::ChForce> *force;
  pointer psVar15;
  pointer psVar16;
  bool bVar17;
  shared_ptr<chrono::ChBody> *body;
  shared_ptr<chrono::ChLinkMarkers> malink;
  string mtabs;
  shared_ptr<chrono::ChLinkBase> local_68;
  string local_58;
  pointer local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  uVar10 = ~(level >> 0x1f) & level;
  while (bVar17 = uVar10 != 0, uVar10 = uVar10 - 1, bVar17) {
    std::__cxx11::string::append((char *)&local_58);
  }
  pCVar8 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar8 = ChStreamOutAscii::operator<<(pCVar8,&local_58);
  pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"List of the ");
  pCVar8 = ChStreamOutAscii::operator<<
                     (pCVar8,(int)((ulong)((long)(this->bodylist).
                                                 super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->bodylist).
                                                super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar8," added rigid bodies: \n");
  local_38 = (this->bodylist).
             super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (this->bodylist).
                super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != local_38; psVar9 = psVar9 + 1)
  {
    pCVar8 = ChStreamOutAscii::operator<<(m_file,&local_58);
    pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"  BODY:       ");
    pCVar8 = ChStreamOutAscii::operator<<
                       (pCVar8,(((psVar9->
                                 super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p);
    ChStreamOutAscii::operator<<(pCVar8,"\n");
    peVar1 = (psVar9->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar2 = (peVar1->marklist).
             super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar11 = (peVar1->marklist).
                   super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar2;
        psVar11 = psVar11 + 1) {
      pCVar8 = ChStreamOutAscii::operator<<(m_file,&local_58);
      pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"    MARKER:  ");
      pCVar8 = ChStreamOutAscii::operator<<
                         (pCVar8,(((psVar11->
                                   super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr)->super_ChObj).m_name._M_dataplus._M_p);
      ChStreamOutAscii::operator<<(pCVar8,"\n");
    }
    peVar1 = (psVar9->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar3 = (peVar1->forcelist).
             super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar15 = (peVar1->forcelist).
                   super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar3;
        psVar15 = psVar15 + 1) {
      pCVar8 = ChStreamOutAscii::operator<<(m_file,&local_58);
      pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"    FORCE:  ");
      pCVar8 = ChStreamOutAscii::operator<<
                         (pCVar8,(((psVar15->
                                   super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr)->super_ChObj).m_name._M_dataplus._M_p);
      ChStreamOutAscii::operator<<(pCVar8,"\n");
    }
  }
  pCVar8 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar8 = ChStreamOutAscii::operator<<(pCVar8,&local_58);
  pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"List of the ");
  pCVar8 = ChStreamOutAscii::operator<<
                     (pCVar8,(int)((ulong)((long)(this->shaftlist).
                                                 super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->shaftlist).
                                                super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar8," added shafts: \n");
  psVar4 = (this->shaftlist).
           super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar13 = (this->shaftlist).
                 super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar13 != psVar4; psVar13 = psVar13 + 1
      ) {
    pCVar8 = ChStreamOutAscii::operator<<(m_file,&local_58);
    pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"  SHAFT:      ");
    pCVar8 = ChStreamOutAscii::operator<<
                       (pCVar8,(((psVar13->
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p);
    ChStreamOutAscii::operator<<(pCVar8,"\n");
  }
  pCVar8 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar8 = ChStreamOutAscii::operator<<(pCVar8,&local_58);
  pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"List of the ");
  pCVar8 = ChStreamOutAscii::operator<<
                     (pCVar8,(int)((ulong)((long)(this->linklist).
                                                 super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->linklist).
                                                super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar8," added links: \n");
  psVar5 = (this->linklist).
           super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar12 = (this->linklist).
                 super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar12 != psVar5; psVar12 = psVar12 + 1
      ) {
    pCVar8 = ChStreamOutAscii::operator<<(m_file,&local_58);
    pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"  LINK:       ");
    pCVar8 = ChStreamOutAscii::operator<<
                       (pCVar8,(((psVar12->
                                 super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p);
    pCVar8 = ChStreamOutAscii::operator<<(pCVar8," [");
    pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"PN6chrono10ChLinkBaseE");
    ChStreamOutAscii::operator<<(pCVar8,"]\n");
    std::dynamic_pointer_cast<chrono::ChLinkMarkers,chrono::ChLinkBase>(&local_68);
    if ((ChAssembly *)
        local_68.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (ChAssembly *)0x0) {
      if ((((vector<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
             *)((long)local_68.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 0xa8))->
          super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        pCVar8 = ChStreamOutAscii::operator<<(m_file,&local_58);
        pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"    marker1:  ");
        pCVar8 = ChStreamOutAscii::operator<<
                           (pCVar8,(char *)(((((vector<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                                                *)((long)local_68.
                                                  super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr + 0xa8))->
                                             super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                                             )._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_refcount._M_pi);
        ChStreamOutAscii::operator<<(pCVar8,"\n");
      }
      if ((((vector<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
             *)((long)local_68.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 0xc0))->
          super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
          )._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pCVar8 = ChStreamOutAscii::operator<<(m_file,&local_58);
        pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"    marker2:  ");
        pCVar8 = ChStreamOutAscii::operator<<
                           (pCVar8,(char *)(((((vector<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                                                *)((long)local_68.
                                                  super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr + 0xc0))->
                                             super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_refcount._M_pi);
        ChStreamOutAscii::operator<<(pCVar8,"\n");
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pCVar8 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar8 = ChStreamOutAscii::operator<<(pCVar8,&local_58);
  pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"List of the ");
  pCVar8 = ChStreamOutAscii::operator<<
                     (pCVar8,(int)((ulong)((long)(this->meshlist).
                                                 super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->meshlist).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar8," added meshes: \n");
  psVar6 = (this->meshlist).
           super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar14 = (this->meshlist).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar6; psVar14 = psVar14 + 1
      ) {
    pCVar8 = ChStreamOutAscii::operator<<(m_file,&local_58);
    pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"  MESH :      ");
    pCVar8 = ChStreamOutAscii::operator<<
                       (pCVar8,(((psVar14->
                                 super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj.
                               m_name._M_dataplus._M_p);
    ChStreamOutAscii::operator<<(pCVar8,"\n");
  }
  pCVar8 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar8 = ChStreamOutAscii::operator<<(pCVar8,&local_58);
  pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"List of other ");
  pCVar8 = ChStreamOutAscii::operator<<
                     (pCVar8,(int)((ulong)((long)(this->otherphysicslist).
                                                 super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->otherphysicslist).
                                                super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar8," added physic items: \n");
  psVar7 = (this->otherphysicslist).
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar16 = (this->otherphysicslist).
                 super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar16 != psVar7; psVar16 = psVar16 + 1
      ) {
    pCVar8 = ChStreamOutAscii::operator<<(m_file,&local_58);
    pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"  PHYSIC ITEM: ");
    pCVar8 = ChStreamOutAscii::operator<<
                       (pCVar8,(((psVar16->
                                 super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->super_ChObj).m_name._M_dataplus._M_p);
    pCVar8 = ChStreamOutAscii::operator<<(pCVar8," [");
    pCVar8 = ChStreamOutAscii::operator<<(pCVar8,"PN6chrono13ChPhysicsItemE");
    ChStreamOutAscii::operator<<(pCVar8,"]\n");
    std::dynamic_pointer_cast<chrono::ChAssembly,chrono::ChPhysicsItem>
              ((shared_ptr<chrono::ChPhysicsItem> *)&local_68);
    if ((ChAssembly *)
        local_68.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (ChAssembly *)0x0) {
      ShowHierarchy((ChAssembly *)
                    local_68.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,m_file,level + 1);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  ChStreamOutAscii::operator<<(m_file,"\n\n");
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void ChAssembly::ShowHierarchy(ChStreamOutAscii& m_file, int level) const {
    std::string mtabs;
    for (int i = 0; i < level; ++i)
        mtabs += "  ";

    m_file << "\n" << mtabs << "List of the " << (int)bodylist.size() << " added rigid bodies: \n";
    for (auto& body : bodylist) {
        m_file << mtabs << "  BODY:       " << body->GetName() << "\n";

        for (auto& marker : body->GetMarkerList()) {
            m_file << mtabs << "    MARKER:  " << marker->GetName() << "\n";
        }

        for (auto& force : body->GetForceList()) {
            m_file << mtabs << "    FORCE:  " << force->GetName() << "\n";
        }
    }

    m_file << "\n" << mtabs << "List of the " << (int)shaftlist.size() << " added shafts: \n";
    for (auto& shaft : shaftlist) {
        m_file << mtabs << "  SHAFT:      " << shaft->GetName() << "\n";
    }

    m_file << "\n" << mtabs << "List of the " << (int)linklist.size() << " added links: \n";
    for (auto& link : linklist) {
        m_file << mtabs << "  LINK:       " << link->GetName() << " [" << typeid(link.get()).name() << "]\n";
        if (auto malink = std::dynamic_pointer_cast<ChLinkMarkers>(link)) {
            if (malink->GetMarker1())
                m_file << mtabs << "    marker1:  " << malink->GetMarker1()->GetName() << "\n";
            if (malink->GetMarker2())
                m_file << mtabs << "    marker2:  " << malink->GetMarker2()->GetName() << "\n";
        }
    }

    m_file << "\n" << mtabs << "List of the " << (int)meshlist.size() << " added meshes: \n";
    for (auto& mesh : meshlist) {
        m_file << mtabs << "  MESH :      " << mesh->GetName() << "\n";
    }

    m_file << "\n" << mtabs << "List of other " << (int)otherphysicslist.size() << " added physic items: \n";
    for (auto& item : otherphysicslist) {
        m_file << mtabs << "  PHYSIC ITEM: " << item->GetName() << " [" << typeid(item.get()).name() << "]\n";

        // recursion:
        if (auto assem = std::dynamic_pointer_cast<ChAssembly>(item))
            assem->ShowHierarchy(m_file, level + 1);
    }

    m_file << "\n\n";
}